

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void generateColumnNames(Parse *pParse,SrcList *pTabList,ExprList *pEList)

{
  ushort uVar1;
  uint uVar2;
  Vdbe *pVVar3;
  sqlite3 *db;
  ExprList_item *pEVar4;
  Expr *pEVar5;
  Table *pTVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  code *xDel;
  int *piVar12;
  long lVar13;
  NameContext local_68;
  
  if (pParse->explain != '\0') {
    return;
  }
  pVVar3 = pParse->pVdbe;
  if ((pVVar3 != (Vdbe *)0x0 && pParse->colNamesSet == '\0') &&
     (db = pParse->db, db->mallocFailed == '\0')) {
    pParse->colNamesSet = '\x01';
    uVar2 = db->flags;
    sqlite3VdbeSetNumCols(pVVar3,pEList->nExpr);
    for (lVar10 = 0; uVar7 = (ulong)pEList->nExpr, lVar10 < (long)uVar7; lVar10 = lVar10 + 1) {
      pEVar4 = pEList->a;
      pEVar5 = pEVar4[lVar10].pExpr;
      if (pEVar5 != (Expr *)0x0) {
        pcVar8 = pEVar4[lVar10].zName;
        if (pcVar8 == (char *)0x0) {
          if (pEVar5->op == 0x98) {
            if (pTabList == (SrcList *)0x0) goto LAB_001588f5;
LAB_00158862:
            uVar1 = pTabList->nSrc;
            if ((short)uVar1 < 1) {
              uVar1 = 0;
            }
            uVar11 = pEVar5->iColumn;
            uVar7 = 0;
            for (piVar12 = &pTabList->a[0].iCursor;
                (uVar9 = (ulong)uVar1, uVar1 != uVar7 && (uVar9 = uVar7, *piVar12 != pEVar5->iTable)
                ); piVar12 = piVar12 + 0x1a) {
              uVar7 = uVar7 + 1;
            }
            pTVar6 = pTabList->a[uVar9].pTab;
            if ((short)uVar11 < 0) {
              uVar11 = pTVar6->iPKey;
              pcVar8 = "rowid";
              if (-1 < (short)uVar11) goto LAB_001588bc;
            }
            else {
LAB_001588bc:
              pcVar8 = pTVar6->aCol[uVar11].zName;
            }
            if ((uVar2 & 0xc) == 0) goto LAB_001588f5;
            if ((uVar2 & 4) == 0) goto LAB_0015882f;
            pcVar8 = sqlite3MPrintf(db,"%s.%s",pTVar6->zName);
          }
          else {
            if ((pTabList != (SrcList *)0x0) && (pEVar5->op == 0x9a)) goto LAB_00158862;
LAB_001588f5:
            pcVar8 = sqlite3DbStrDup(db,pEVar4[lVar10].zSpan);
          }
          xDel = sqlite3MallocSize;
        }
        else {
LAB_0015882f:
          xDel = (_func_void_void_ptr *)0xffffffffffffffff;
        }
        sqlite3VdbeSetColName(pVVar3,(int)lVar10,0,pcVar8,xDel);
      }
    }
    pVVar3 = pParse->pVdbe;
    lVar10 = 0;
    local_68.pParse = pParse;
    local_68.pSrcList = pTabList;
    for (lVar13 = 0; lVar13 < (int)uVar7; lVar13 = lVar13 + 1) {
      pcVar8 = columnType(&local_68,*(Expr **)((long)&pEList->a->pExpr + lVar10),(char **)0x0,
                          (char **)0x0,(char **)0x0);
      sqlite3VdbeSetColName(pVVar3,(int)lVar13,1,pcVar8,(_func_void_void_ptr *)0xffffffffffffffff);
      uVar7 = (ulong)(uint)pEList->nExpr;
      lVar10 = lVar10 + 0x20;
    }
  }
  return;
}

Assistant:

static void generateColumnNames(
  Parse *pParse,      /* Parser context */
  SrcList *pTabList,  /* List of tables */
  ExprList *pEList    /* Expressions defining the result set */
){
  Vdbe *v = pParse->pVdbe;
  int i, j;
  sqlite3 *db = pParse->db;
  int fullNames, shortNames;

#ifndef SQLITE_OMIT_EXPLAIN
  /* If this is an EXPLAIN, skip this step */
  if( pParse->explain ){
    return;
  }
#endif

  if( pParse->colNamesSet || NEVER(v==0) || db->mallocFailed ) return;
  pParse->colNamesSet = 1;
  fullNames = (db->flags & SQLITE_FullColNames)!=0;
  shortNames = (db->flags & SQLITE_ShortColNames)!=0;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p;
    p = pEList->a[i].pExpr;
    if( NEVER(p==0) ) continue;
    if( pEList->a[i].zName ){
      char *zName = pEList->a[i].zName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( (p->op==TK_COLUMN || p->op==TK_AGG_COLUMN) && pTabList ){
      Table *pTab;
      char *zCol;
      int iCol = p->iColumn;
      for(j=0; ALWAYS(j<pTabList->nSrc); j++){
        if( pTabList->a[j].iCursor==p->iTable ) break;
      }
      assert( j<pTabList->nSrc );
      pTab = pTabList->a[j].pTab;
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zName;
      }
      if( !shortNames && !fullNames ){
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, 
            sqlite3DbStrDup(db, pEList->a[i].zSpan), SQLITE_DYNAMIC);
      }else if( fullNames ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, 
          sqlite3DbStrDup(db, pEList->a[i].zSpan), SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}